

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

int __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>
::
AddConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>
           *this,int d,
          CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>
          *args)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  int local_14;
  
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>::Container>>
  ::
  emplace_back<int&,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>
            ((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcoshId>>::Container>>
              *)(this + 0xd0),&local_14,args);
  lVar1 = *(long *)(this + 0x118);
  lVar3 = *(long *)(this + 0x100);
  uVar2 = lVar3 - *(long *)(this + 0x108);
  if (uVar2 == 0) {
    lVar3 = *(long *)(lVar1 + -8) + 0x200;
  }
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
  ::ExportConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
                      *)this,(int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 6) +
                             (int)(uVar2 >> 6) +
                             (((int)lVar1 - (int)*(undefined8 *)(this + 0xf8)) +
                              (uint)(lVar1 != 0) * -8 & 0xfffffff8) + -1,
                     (Container *)(lVar3 + -0x40));
  return (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 6) +
         (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 6) +
         (((int)*(long *)(this + 0x118) - *(int *)(this + 0xf8)) +
          (uint)(*(long *)(this + 0x118) != 0) * -8 & 0xfffffff8) + -1;
}

Assistant:

int AddConstraint(int d, Args&&... args)
  {
    cons_.emplace_back( d, std::move(args)... );
    ExportConstraint(cons_.size()-1, cons_.back());
    // fmt::MemoryWriter wrt;
    // WriteCon2JSON(wrt, cons_.size()-1, cons_.back());
    // printf("%s\n", wrt.c_str());
    return cons_.size()-1;
  }